

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar __thiscall
Eigen::
DenseBase<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,-1,1,0,-1,1>>>
::redux<Eigen::internal::scalar_min_op<double,double,0>>
          (DenseBase<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,_1,1,0,_1,1>>>
           *this,scalar_min_op<double,_double,_0> *func)

{
  Scalar SVar1;
  ThisEvaluator thisEval;
  redux_evaluator<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>_>
  local_10;
  
  if (0 < (long)(*(plainobjectbase_evaluator_data<std::complex<double>,_0> **)this)[1].data) {
    local_10.
    super_evaluator<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_double>
    .m_d.argImpl.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>_>.
    m_d.data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>_>
                )(*(plainobjectbase_evaluator_data<std::complex<double>,_0> **)this)->data;
    SVar1 = internal::
            redux_impl<Eigen::internal::scalar_min_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,-1,1,0,-1,1>>>,0,0>
            ::
            run<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,_1,1,0,_1,1>>>
                      (&local_10,func,
                       (CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>
                        *)this);
    return SVar1;
  }
  __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Redux.h"
                ,0x19b,
                "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>, Eigen::Matrix<std::complex<double>, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>, Eigen::Matrix<std::complex<double>, -1, 1>>, BinaryOp = Eigen::internal::scalar_min_op<double>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  // The initial expression is passed to the reducer as an additional argument instead of
  // passing it as a member of redux_evaluator to help  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func, derived());
}